

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall libtorrent::dht::dht_tracker::refresh_timeout(dht_tracker *this,error_code *e)

{
  session_settings *psVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  int iVar4;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_58;
  undefined1 local_50 [8];
  ulong local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  if ((e->failed_ == false) && (this->m_running == true)) {
    for (p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var2)) {
      dht::node::tick((node *)&p_Var2[1]._M_left);
    }
    psVar1 = this->m_settings;
    local_50 = (undefined1  [8])&psVar1->m_mutex;
    local_48 = local_48 & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_50);
    local_48._0_1_ = true;
    iVar4 = (psVar1->m_store).m_ints._M_elems[0x90];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    (this->m_blocker).m_block_timeout = iVar4;
    psVar1 = this->m_settings;
    local_50 = (undefined1  [8])&psVar1->m_mutex;
    local_48._0_1_ = false;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_50);
    local_48 = CONCAT71(local_48._1_7_,true);
    iVar4 = (psVar1->m_store).m_ints._M_elems[0x91];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
    iVar3 = 1;
    if (1 < iVar4) {
      iVar3 = iVar4;
    }
    (this->m_blocker).m_message_rate_limit = iVar3;
    local_50 = (undefined1  [8])0x12a05f200;
    boost::asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::expires_after(&this->m_refresh_timer,(duration *)local_50);
    ::std::__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::dht::dht_tracker,void>
              ((__shared_ptr<libtorrent::dht::dht_tracker,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (__weak_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::dht::dht_tracker>);
    local_50 = (undefined1  [8])refresh_timeout;
    local_48 = 0;
    local_40 = local_60;
    _Stack_38._M_pi = p_Stack_58;
    local_60 = (element_type *)0x0;
    p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::asio::detail::
    deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
    ::
    async_wait<std::_Bind<void(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,std::_Placeholder<1>))(boost::system::error_code_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ((deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>>>
                *)(this->m_refresh_timer).impl_.service_,
               &(this->m_refresh_timer).impl_.implementation_,
               (_Bind<void_(libtorrent::dht::dht_tracker::*(std::shared_ptr<libtorrent::dht::dht_tracker>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                *)local_50,&(this->m_refresh_timer).impl_.executor_);
    if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
    }
    if (p_Stack_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_58);
    }
  }
  return;
}

Assistant:

void dht_tracker::refresh_timeout(error_code const& e)
	{
		COMPLETE_ASYNC("dht_tracker::refresh_timeout");
		if (e || !m_running) return;

		for (auto& n : m_nodes)
			n.second.dht.tick();

		// periodically update the DOS blocker's settings from the dht_settings
		m_blocker.set_block_timer(m_settings.get_int(settings_pack::dht_block_timeout));
		m_blocker.set_rate_limit(m_settings.get_int(settings_pack::dht_block_ratelimit));

		m_refresh_timer.expires_after(seconds(5));
		ADD_OUTSTANDING_ASYNC("dht_tracker::refresh_timeout");
		m_refresh_timer.async_wait(
			std::bind(&dht_tracker::refresh_timeout, self(), _1));
	}